

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall Timer::clockHandler(Timer *this)

{
  bool bVar1;
  timespec cur;
  timespec start;
  AutoLock l;
  Condition c;
  Mutex m;
  
  Condition::Condition(&c);
  Mutex::Mutex(&m,false);
  AutoLock::AutoLock(&l,&m);
  TimeUtils::getCurTime(&start);
  while (this->mClockThread->mStop == false) {
    bVar1 = Condition::Wait(&c,&m,this->mMsPerTick);
    if (bVar1) {
      jh_log_print(1,"void Timer::clockHandler()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Timer.cpp"
                   ,0xb2,"Signal recieved on timer condition????\n");
    }
    else {
      TimeUtils::getCurTime(&cur);
      if ((uint)((int)((ulong)((cur.tv_sec - start.tv_sec) * 0x3e800000000) >> 0x20) +
                (int)((cur.tv_nsec - start.tv_nsec) / 1000000)) < 0x2711) {
        while (this->mMsPerTick <
               (int)((ulong)((cur.tv_sec - start.tv_sec) * 0x3e800000000) >> 0x20) +
               (int)((cur.tv_nsec - start.tv_nsec) / 1000000)) {
          TimeUtils::addOffset(&start,this->mMsPerTick);
          handleTick(this);
        }
      }
      else {
        TimeUtils::getCurTime(&start);
        handleTick(this);
      }
    }
  }
  AutoLock::~AutoLock(&l);
  Mutex::~Mutex(&m);
  Condition::~Condition(&c);
  return;
}

Assistant:

void Timer::clockHandler()
{
	TRACE_BEGIN( LOG_LVL_INFO );	
	struct timespec start, cur;
	Condition c;
	Mutex m;
	AutoLock l(m);
	
	TimeUtils::getCurTime( &start );
	while ( !mClockThread->CheckStop() )
	{	
		// Wait for the tick to timeout
		if (not c.Wait(m, mMsPerTick))
		{
			TimeUtils::getCurTime( &cur );
			
			// Check to see if the clock was set back, or jumps
			// forward by more than 10 seconds. If so, update the
			// starting time to the current time and wait for the next
			// tick.
			if ( TimeUtils::getDifference( &cur, &start ) < 0 or
				 TimeUtils::getDifference( &cur, &start ) > 10000 )
			{
				TimeUtils::getCurTime( &start );
				handleTick();
			}
			else
			{	
				// Get the current time and count ticks until cur time and the 
				// actual tick time are less the mMsPerTick apart.
				while ( TimeUtils::getDifference( &cur, &start ) > mMsPerTick )
				{
					TimeUtils::addOffset( &start, mMsPerTick );
					handleTick();
				}
			}
		}
		else
		{
			LOG_ERR_FATAL("Signal recieved on timer condition????\n");
		}
	}
}